

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qorderedmutexlocker_p.h
# Opt level: O2

bool QOrderedMutexLocker::relock(QBasicMutex *mtx1,QBasicMutex *mtx2)

{
  QBasicMutex *this;
  bool bVar1;
  
  if (mtx1 != mtx2) {
    this = mtx2;
    if (mtx2 <= mtx1) {
      if ((mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
        LOCK();
        bVar1 = (mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
        if (bVar1) {
          (mtx2->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
        }
        UNLOCK();
        if (bVar1) goto LAB_00290ee8;
      }
      QBasicMutex::unlock(mtx1);
      QBasicMutex::lock(mtx2);
      this = mtx1;
    }
    QBasicMutex::lock(this);
  }
LAB_00290ee8:
  return mtx1 != mtx2;
}

Assistant:

static bool relock(QBasicMutex *mtx1, QBasicMutex *mtx2)
    {
        // mtx1 is already locked, mtx2 not... do we need to unlock and relock?
        if (mtx1 == mtx2)
            return false;
        if (std::less<QBasicMutex *>()(mtx1, mtx2)) {
            mtx2->lock();
            return true;
        }
        if (!mtx2->tryLock()) {
            mtx1->unlock();
            mtx2->lock();
            mtx1->lock();
        }
        return true;
    }